

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O0

void __thiscall test_app::~test_app(test_app *this)

{
  void *in_RDI;
  test_app *unaff_retaddr;
  
  ~test_app(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

~test_app()
	{
		release_context();
	}